

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O0

void skiwi::anon_unknown_26::compile_symbol
               (registered_functions *param_1,environment_map *param_2,repl_data *param_3,
               compile_data *param_4,asmcode *code,Symbol *s,compiler_options *ops,operand target)

{
  bool bVar1;
  char *pcVar2;
  operand local_13c;
  operation local_138;
  operand local_134;
  operation local_130;
  operand local_12c [2];
  operation local_124;
  int local_120;
  int local_11c;
  int i_1;
  int end;
  operation local_110;
  operand local_10c;
  operation local_108;
  operand local_104 [2];
  operation local_fc;
  unsigned_long local_f8;
  operand local_ec [2];
  operation local_e4;
  int local_e0;
  int local_dc;
  int i;
  operand local_d4;
  operation local_d0;
  operand local_cc [2];
  operation local_c4;
  int local_c0 [4];
  unsigned_long local_b0;
  operand local_a4 [2];
  operation local_9c [2];
  operand local_94 [2];
  operation local_8c;
  operand local_88 [2];
  operation local_80 [5];
  int local_6c [5];
  string local_58 [4];
  int nr_of_args;
  string str;
  Symbol *s_local;
  asmcode *code_local;
  compile_data *param_3_local;
  repl_data *param_2_local;
  environment_map *param_1_local;
  registered_functions *param_0_local;
  
  str.field_2._8_8_ = s;
  bVar1 = target_is_valid(target);
  if (!bVar1) {
    __assert_fail("target_is_valid(target)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi/compiler.cpp"
                  ,0x1d0,
                  "void skiwi::(anonymous namespace)::compile_symbol(registered_functions &, environment_map &, repl_data &, compile_data &, asmcode &, const Symbol &, const compiler_options &, asmcode::operand)"
                 );
  }
  std::__cxx11::string::string(local_58,(string *)(str.field_2._8_8_ + 8));
  local_6c[4] = std::__cxx11::string::length();
  if ((ops->safe_primitives & 1U) != 0) {
    local_6c[3] = 0x40;
    local_6c[2] = 9;
    local_6c[1] = 0x39;
    local_6c[0] = (local_6c[4] >> 3) + 2;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
              (code,(operation *)(local_6c + 3),(operand *)(local_6c + 2),(operand *)(local_6c + 1),
               local_6c);
    check_heap(code,re_symbol_heap_overflow);
  }
  local_80[0] = MOV;
  local_88[1] = 0x18;
  local_88[0] = RBP;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_80,local_88 + 1,local_88);
  local_8c = OR;
  local_94[1] = 0x18;
  local_94[0] = NUMBER;
  local_9c[1] = 5;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_8c,local_94 + 1,local_94,(int *)(local_9c + 1));
  local_9c[0] = MOV;
  local_a4[1] = 9;
  local_a4[0] = NUMBER;
  local_b0 = 0x300000000000000;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,local_9c,local_a4 + 1,local_a4,&local_b0);
  local_c0[3] = 0x49;
  local_c0[2] = 9;
  local_c0[1] = 0x39;
  local_c0[0] = (local_6c[4] >> 3) + 1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)(local_c0 + 3),(operand *)(local_c0 + 2),(operand *)(local_c0 + 1),
             local_c0);
  local_c4 = MOV;
  local_cc[1] = 0x20;
  local_cc[0] = RAX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,&local_c4,local_cc + 1,local_cc);
  local_d0 = ADD;
  local_d4 = RBP;
  i = 0x39;
  local_dc = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_d0,&local_d4,(operand *)&i,&local_dc);
  for (local_e0 = 0; local_e0 < local_6c[4]; local_e0 = local_e0 + 1) {
    local_e4 = MOV;
    local_ec[1] = 9;
    local_ec[0] = NUMBER;
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_58);
    local_f8 = (unsigned_long)*pcVar2;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
              (code,&local_e4,local_ec + 1,local_ec,&local_f8);
    local_fc = MOV;
    local_104[1] = 0x30;
    local_104[0] = AL;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
              (code,&local_fc,local_104 + 1,local_104);
    local_108 = INC;
    local_10c = RBP;
    assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
              (code,&local_108,&local_10c);
  }
  local_110 = XOR;
  end = 9;
  i_1 = 9;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,&local_110,(operand *)&end,(operand *)&i_1);
  local_11c = ((local_6c[4] >> 3) + 1) * 8;
  for (local_120 = local_6c[4]; local_120 < local_11c; local_120 = local_120 + 1) {
    local_124 = MOV;
    local_12c[1] = 0x30;
    local_12c[0] = AL;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
              (code,&local_124,local_12c + 1,local_12c);
    local_130 = INC;
    local_134 = RBP;
    assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
              (code,&local_130,&local_134);
  }
  local_138 = MOV;
  local_13c = R15;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand&,assembler::asmcode::operand>
            (code,&local_138,&target,&local_13c);
  std::__cxx11::string::~string(local_58);
  return;
}

Assistant:

inline void compile_symbol(registered_functions&, environment_map&, repl_data&, compile_data&, asmcode& code, const Symbol& s, const compiler_options& ops, asmcode::operand target)
    {
    assert(target_is_valid(target));
    std::string str = s.value;
    int nr_of_args = (int)str.length();

    if (ops.safe_primitives)
      {
      code.add(asmcode::MOV, asmcode::RAX, asmcode::NUMBER, ((nr_of_args >> 3) + 2));
      check_heap(code, re_symbol_heap_overflow);
      }

    code.add(asmcode::MOV, asmcode::R15, ALLOC);
    code.add(asmcode::OR, asmcode::R15, asmcode::NUMBER, block_tag);


    code.add(asmcode::MOV, asmcode::RAX, asmcode::NUMBER, (uint64_t)symbol_tag << (uint64_t)block_shift);
    code.add(asmcode::OR, asmcode::RAX, asmcode::NUMBER, ((nr_of_args >> 3) + 1));
    code.add(asmcode::MOV, MEM_ALLOC, asmcode::RAX);
    code.add(asmcode::ADD, ALLOC, asmcode::NUMBER, CELLS(1));

    for (int i = 0; i < nr_of_args; ++i)
      {
      code.add(asmcode::MOV, asmcode::RAX, asmcode::NUMBER, (uint64_t)str[i]);
      code.add(asmcode::MOV, BYTE_MEM_ALLOC, asmcode::AL);
      code.add(asmcode::INC, ALLOC);
      }
    code.add(asmcode::XOR, asmcode::RAX, asmcode::RAX);
    int end = ((nr_of_args >> 3) + 1) << 3;
    for (int i = nr_of_args; i < end; ++i)
      {
      code.add(asmcode::MOV, BYTE_MEM_ALLOC, asmcode::AL);
      code.add(asmcode::INC, ALLOC);
      }

    code.add(asmcode::MOV, target, asmcode::R15);
    }